

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void serialize_model<_IO_FILE*>(TreesIndexer *model,_IO_FILE **out)

{
  bool bVar1;
  const_iterator node;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_RDI;
  SingleTreeIndex *tree;
  const_iterator __end1;
  const_iterator __begin1;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range1;
  size_t vec_size;
  reference in_stack_ffffffffffffffc8;
  FILE **in_stack_ffffffffffffffd0;
  __normal_iterator<const_SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
  in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  
  if (!interrupt_switch) {
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::size(in_RDI);
    write_bytes<unsigned_long>
              (in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8._M_current,
               in_stack_ffffffffffffffd0);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_ffffffffffffffc8);
    node = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end
                     ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                      in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)node._M_current,
                              (__normal_iterator<const_SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<const_SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
           ::operator*((__normal_iterator<const_SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                        *)&stack0xffffffffffffffd8);
      serialize_node<_IO_FILE*>(node._M_current,(_IO_FILE **)in_stack_ffffffffffffffc8);
      __gnu_cxx::
      __normal_iterator<const_SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
      ::operator++((__normal_iterator<const_SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                    *)&stack0xffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void serialize_model(const TreesIndexer &model, otype &out)
{
    if (interrupt_switch) return;

    size_t vec_size = model.indices.size();
    write_bytes<size_t>((void*)&vec_size, (size_t)1, out);

    for (const auto &tree : model.indices)
        serialize_node(tree, out);
}